

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O0

int amqp_ssl_socket_open(void *base,char *host,int port,timeval *timeout)

{
  int iVar1;
  SSL *pSVar2;
  ulong uVar3;
  BIO_METHOD *type;
  amqp_time_t deadline_00;
  long lVar4;
  X509 *a;
  size_t sVar5;
  char *in_RSI;
  long in_RDI;
  char *unaff_retaddr;
  amqp_time_t in_stack_00000008;
  BIO *bio;
  X509 *cert;
  amqp_time_t deadline;
  int status;
  long result;
  amqp_ssl_socket_t *self;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  amqp_time_t *in_stack_ffffffffffffffa8;
  int local_3c;
  int in_stack_fffffffffffffffc;
  
  if (*(int *)(in_RDI + 0x10) == -1) {
    ERR_clear_error();
    pSVar2 = SSL_new(*(SSL_CTX **)(in_RDI + 8));
    *(SSL **)(in_RDI + 0x18) = pSVar2;
    if (*(long *)(in_RDI + 0x18) == 0) {
      uVar3 = ERR_peek_error();
      *(int *)(in_RDI + 0x28) = (int)uVar3;
      local_3c = -0x200;
    }
    else {
      local_3c = amqp_time_from_now(in_stack_ffffffffffffffa8,
                                    (timeval *)
                                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      if (local_3c == 0) {
        iVar1 = amqp_open_socket_inner(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_00000008);
        *(int *)(in_RDI + 0x10) = iVar1;
        if (*(int *)(in_RDI + 0x10) < 0) {
          local_3c = *(int *)(in_RDI + 0x10);
          iVar1 = amqp_os_socket_error();
          *(int *)(in_RDI + 0x28) = iVar1;
          *(undefined4 *)(in_RDI + 0x10) = 0xffffffff;
        }
        else {
          type = (BIO_METHOD *)amqp_openssl_bio();
          deadline_00.time_point_ns = (uint64_t)BIO_new(type);
          if ((BIO *)deadline_00.time_point_ns == (BIO *)0x0) {
            local_3c = -1;
          }
          else {
            BIO_int_ctrl((BIO *)deadline_00.time_point_ns,0x68,0,*(int *)(in_RDI + 0x10));
            SSL_set_bio(*(SSL **)(in_RDI + 0x18),(BIO *)deadline_00.time_point_ns,
                        (BIO *)deadline_00.time_point_ns);
            lVar4 = SSL_ctrl(*(SSL **)(in_RDI + 0x18),0x37,0,in_RSI);
            if ((int)lVar4 == 0) {
              iVar1 = SSL_get_error(*(SSL **)(in_RDI + 0x18),0);
              *(int *)(in_RDI + 0x28) = iVar1;
              local_3c = -0x200;
            }
            else {
              do {
                iVar1 = SSL_connect(*(SSL **)(in_RDI + 0x18));
                if (iVar1 == 1) {
                  a = (X509 *)SSL_get1_peer_certificate(*(undefined8 *)(in_RDI + 0x18));
                  if (*(int *)(in_RDI + 0x20) == 0) {
LAB_00115201:
                    if (*(int *)(in_RDI + 0x24) == 0) {
LAB_0011528a:
                      X509_free(a);
                      *(undefined4 *)(in_RDI + 0x28) = 0;
                      return 0;
                    }
                    if (a != (X509 *)0x0) {
                      sVar5 = strlen(in_RSI);
                      iVar1 = X509_check_host(a,in_RSI,sVar5,4,0);
                      if (iVar1 == 1) goto LAB_0011528a;
                      *(undefined4 *)(in_RDI + 0x28) = 0;
                      local_3c = -0x201;
                      goto LAB_001152b2;
                    }
                    *(undefined4 *)(in_RDI + 0x28) = 0;
                    local_3c = -0x201;
                  }
                  else if (a == (X509 *)0x0) {
                    *(undefined4 *)(in_RDI + 0x28) = 0;
                    local_3c = -0x202;
                  }
                  else {
                    lVar4 = SSL_get_verify_result(*(SSL **)(in_RDI + 0x18));
                    if (lVar4 == 0) goto LAB_00115201;
                    *(int *)(in_RDI + 0x28) = (int)lVar4;
                    local_3c = -0x202;
LAB_001152b2:
                    X509_free(a);
                  }
                  SSL_shutdown(*(SSL **)(in_RDI + 0x18));
                  break;
                }
                iVar1 = SSL_get_error(*(SSL **)(in_RDI + 0x18),iVar1);
                *(int *)(in_RDI + 0x28) = iVar1;
                if (*(int *)(in_RDI + 0x28) == 2) {
                  local_3c = amqp_poll(2,in_stack_ffffffffffffffa0,deadline_00);
                }
                else if (*(int *)(in_RDI + 0x28) == 3) {
                  local_3c = amqp_poll(3,in_stack_ffffffffffffffa0,deadline_00);
                }
                else {
                  local_3c = -0x203;
                }
              } while (local_3c == 0);
            }
          }
          amqp_os_socket_close(0);
          *(undefined4 *)(in_RDI + 0x10) = 0xffffffff;
        }
        SSL_free(*(SSL **)(in_RDI + 0x18));
        *(undefined8 *)(in_RDI + 0x18) = 0;
      }
    }
  }
  else {
    local_3c = -0x12;
  }
  return local_3c;
}

Assistant:

static int amqp_ssl_socket_open(void *base, const char *host, int port,
                                const struct timeval *timeout) {
  struct amqp_ssl_socket_t *self = (struct amqp_ssl_socket_t *)base;
  long result;
  int status;
  amqp_time_t deadline;
  X509 *cert;
  BIO *bio;
  if (-1 != self->sockfd) {
    return AMQP_STATUS_SOCKET_INUSE;
  }
  ERR_clear_error();

  self->ssl = SSL_new(self->ctx);
  if (!self->ssl) {
    self->internal_error = ERR_peek_error();
    status = AMQP_STATUS_SSL_ERROR;
    goto exit;
  }

  status = amqp_time_from_now(&deadline, timeout);
  if (AMQP_STATUS_OK != status) {
    return status;
  }

  self->sockfd = amqp_open_socket_inner(host, port, deadline);
  if (0 > self->sockfd) {
    status = self->sockfd;
    self->internal_error = amqp_os_socket_error();
    self->sockfd = -1;
    goto error_out1;
  }

  bio = BIO_new(amqp_openssl_bio());
  if (!bio) {
    status = AMQP_STATUS_NO_MEMORY;
    goto error_out2;
  }

  BIO_set_fd(bio, self->sockfd, BIO_NOCLOSE);
  SSL_set_bio(self->ssl, bio, bio);

  status = SSL_set_tlsext_host_name(self->ssl, host);
  if (!status) {
    self->internal_error = SSL_get_error(self->ssl, status);
    status = AMQP_STATUS_SSL_ERROR;
    goto error_out2;
  }

start_connect:
  status = SSL_connect(self->ssl);
  if (status != 1) {
    self->internal_error = SSL_get_error(self->ssl, status);
    switch (self->internal_error) {
      case SSL_ERROR_WANT_READ:
        status = amqp_poll(self->sockfd, AMQP_SF_POLLIN, deadline);
        break;
      case SSL_ERROR_WANT_WRITE:
        status = amqp_poll(self->sockfd, AMQP_SF_POLLOUT, deadline);
        break;
      default:
        status = AMQP_STATUS_SSL_CONNECTION_FAILED;
    }
    if (AMQP_STATUS_OK == status) {
      goto start_connect;
    }
    goto error_out2;
  }

#if OPENSSL_VERSION_NUMBER < 0x30000000L
  cert = SSL_get_peer_certificate(self->ssl);
#else
  cert = SSL_get1_peer_certificate(self->ssl);
#endif

  if (self->verify_peer) {
    if (!cert) {
      self->internal_error = 0;
      status = AMQP_STATUS_SSL_PEER_VERIFY_FAILED;
      goto error_out3;
    }

    result = SSL_get_verify_result(self->ssl);
    if (X509_V_OK != result) {
      self->internal_error = result;
      status = AMQP_STATUS_SSL_PEER_VERIFY_FAILED;
      goto error_out4;
    }
  }
  if (self->verify_hostname) {
    if (!cert) {
      self->internal_error = 0;
      status = AMQP_STATUS_SSL_HOSTNAME_VERIFY_FAILED;
      goto error_out3;
    }

    if (1 != X509_check_host(cert, host, strlen(host),
                             X509_CHECK_FLAG_NO_PARTIAL_WILDCARDS, NULL)) {
      self->internal_error = 0;
      status = AMQP_STATUS_SSL_HOSTNAME_VERIFY_FAILED;
      goto error_out4;
    }
  }

  X509_free(cert);
  self->internal_error = 0;
  status = AMQP_STATUS_OK;

exit:
  return status;

error_out4:
  X509_free(cert);
error_out3:
  SSL_shutdown(self->ssl);
error_out2:
  amqp_os_socket_close(self->sockfd);
  self->sockfd = -1;
error_out1:
  SSL_free(self->ssl);
  self->ssl = NULL;
  goto exit;
}